

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

void __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
::~ConcurrentQueue(ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                   *this)

{
  bool *pbVar1;
  Block *pBVar2;
  ImplicitProducerHash *pIVar3;
  __pointer_type pBVar4;
  atomic<duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
  *in_RDI;
  __pointer_type next_1;
  Block *block;
  size_t i;
  ImplicitProducerHash *prev;
  __pointer_type hash;
  ProducerBase *next;
  __pointer_type ptr;
  Block *in_stack_ffffffffffffffb0;
  Block *local_38;
  size_t local_30;
  __pointer_type local_20;
  Block *local_10;
  
  local_10 = (Block *)std::
                      atomic<duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
                      ::load((atomic<duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
                              *)in_RDI,(memory_order)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  while (local_10 != (Block *)0x0) {
    pBVar2 = (Block *)ProducerBase::next_prod((ProducerBase *)local_10);
    if (*(long *)(local_10->elements + 0x18) != 0) {
      **(undefined8 **)(local_10->elements + 0x18) = 0;
    }
    in_stack_ffffffffffffffb0 = pBVar2;
    ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
    ::
    destroy<duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase>
              ((ProducerBase *)0x9adbb8);
    local_10 = pBVar2;
  }
  pIVar3 = std::
           atomic<duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
           ::load((atomic<duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
                   *)in_RDI,(memory_order)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  while (local_20 = pIVar3, local_20 != (__pointer_type)0x0) {
    pIVar3 = local_20->prev;
    if (pIVar3 != (ImplicitProducerHash *)0x0) {
      for (local_30 = 0; local_30 != local_20->capacity; local_30 = local_30 + 1) {
      }
      ConcurrentQueueDefaultTraits::free(local_20);
    }
  }
  pBVar2 = FreeList<duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block>
           ::head_unsafe((FreeList<duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block>
                          *)0x9adc49);
  local_38 = pBVar2;
  while (local_38 != (Block *)0x0) {
    pBVar4 = std::
             atomic<duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
             ::load(in_RDI,(memory_order)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    pbVar1 = &local_38->dynamicallyAllocated;
    local_38 = pBVar4;
    if ((*pbVar1 & 1U) != 0) {
      ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
      ::
      destroy<duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block>
                ((Block *)0x9adc90);
    }
  }
  ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
  ::
  destroy_array<duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block>
            (in_stack_ffffffffffffffb0,(size_t)pBVar2);
  return;
}

Assistant:

~ConcurrentQueue()
	{
		// Destroy producers
		auto ptr = producerListTail.load(std::memory_order_relaxed);
		while (ptr != nullptr) {
			auto next = ptr->next_prod();
			if (ptr->token != nullptr) {
				ptr->token->producer = nullptr;
			}
			destroy(ptr);
			ptr = next;
		}
		
		// Destroy implicit producer hash tables
		MOODYCAMEL_CONSTEXPR_IF (INITIAL_IMPLICIT_PRODUCER_HASH_SIZE != 0) {
			auto hash = implicitProducerHash.load(std::memory_order_relaxed);
			while (hash != nullptr) {
				auto prev = hash->prev;
				if (prev != nullptr) {		// The last hash is part of this object and was not allocated dynamically
					for (size_t i = 0; i != hash->capacity; ++i) {
						hash->entries[i].~ImplicitProducerKVP();
					}
					hash->~ImplicitProducerHash();
					(Traits::free)(hash);
				}
				hash = prev;
			}
		}
		
		// Destroy global free list
		auto block = freeList.head_unsafe();
		while (block != nullptr) {
			auto next = block->freeListNext.load(std::memory_order_relaxed);
			if (block->dynamicallyAllocated) {
				destroy(block);
			}
			block = next;
		}
		
		// Destroy initial free list
		destroy_array(initialBlockPool, initialBlockPoolSize);
	}